

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_utils.c
# Opt level: O2

int64_t file_size(char *path)

{
  int iVar1;
  stat sb;
  
  iVar1 = stat(path,(stat *)&sb);
  if (iVar1 < 0) {
    sb.st_size = -1;
  }
  return sb.st_size;
}

Assistant:

int64_t file_size (const char *path) {
    #ifdef WIN32
    WIN32_FILE_ATTRIBUTE_DATA fileInfo;
    if (GetFileAttributesExA(path, GetFileExInfoStandard, (void*)&fileInfo) == 0) return -1;
    return (int64_t)(((__int64)fileInfo.nFileSizeHigh) << 32 ) + fileInfo.nFileSizeLow;
    #else
    struct stat sb;
    if (stat(path, &sb) < 0) return -1;
    return (int64_t)sb.st_size;
    #endif
}